

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

uint P_GetSkyboxPortal(ASkyViewpoint *actor)

{
  FSectorPortal *pFVar1;
  FSectorPortal *pFVar2;
  bool bVar3;
  uint uVar4;
  AActor *pAVar5;
  PClass *ti;
  uint i;
  ulong uVar6;
  long lVar7;
  
  if (actor == (ASkyViewpoint *)0x0) {
    uVar6 = 1;
  }
  else {
    lVar7 = 0x38;
    for (uVar6 = 0; uVar6 < sectorPortals.Count; uVar6 = uVar6 + 1) {
      pAVar5 = GC::ReadBarrier<AActor>((AActor **)((long)&(sectorPortals.Array)->mType + lVar7));
      if (pAVar5 == &actor->super_AActor) goto LAB_004f651e;
      lVar7 = lVar7 + 0x40;
    }
    uVar4 = TArray<FSectorPortal,_FSectorPortal>::Reserve(&sectorPortals,1);
    pFVar2 = sectorPortals.Array;
    uVar6 = (ulong)uVar4;
    pFVar1 = sectorPortals.Array + uVar4;
    pFVar1->mType = 0;
    pFVar1->mFlags = 0;
    pFVar1->mPartner = 0;
    pFVar1->mPlane = 0;
    pFVar2[uVar4].mOrigin = (sector_t *)0x0;
    (&pFVar2[uVar4].mOrigin)[1] = (sector_t *)0x0;
    pFVar2[uVar4].mDisplacement.X = 0.0;
    pFVar2[uVar4].mDisplacement.Y = 0.0;
    pFVar2[uVar4].mPlaneZ = 0.0;
    *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(&pFVar2[uVar4].mPlaneZ + 1) =
         (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
    ti = DObject::GetClass((DObject *)actor);
    bVar3 = PClass::IsAncestorOf(ASkyCamCompat::RegistrationInfo.MyClass,ti);
    pFVar1 = sectorPortals.Array;
    sectorPortals.Array[uVar4].mFlags = (uint)!bVar3;
    pFVar1[uVar4].mSkybox.field_0.p = &actor->super_AActor;
    sectorPortals.Array[uVar4].mDestination = (actor->super_AActor).Sector;
  }
LAB_004f651e:
  return (uint)uVar6;
}

Assistant:

unsigned P_GetSkyboxPortal(ASkyViewpoint *actor)
{
	if (actor == NULL) return 1;	// this means a regular sky.
	for (unsigned i = 0;i<sectorPortals.Size();i++)
	{
		if (sectorPortals[i].mSkybox == actor) return i;
	}
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = PORTS_SKYVIEWPOINT;
	sectorPortals[i].mFlags = actor->GetClass()->IsDescendantOf(RUNTIME_CLASS(ASkyCamCompat)) ? 0 : PORTSF_SKYFLATONLY;
	sectorPortals[i].mSkybox = actor;
	sectorPortals[i].mDestination = actor->Sector;
	return i;
}